

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.hpp
# Opt level: O2

bool boost::unit_test::operator<(basic_cstring<const_char> *x,basic_cstring<const_char> *y)

{
  int iVar1;
  ulong uVar2;
  size_t n;
  
  n = (long)x->m_end - (long)x->m_begin;
  uVar2 = (long)y->m_end - (long)y->m_begin;
  if (n == uVar2) {
    iVar1 = ut_detail::bcs_char_traits_impl<const_char>::compare(x->m_begin,y->m_begin,n);
    return SUB41((uint)iVar1 >> 0x1f,0);
  }
  return n < uVar2;
}

Assistant:

inline bool
operator <( boost::unit_test::basic_cstring<CharT> const& x,
            boost::unit_test::basic_cstring<CharT> const& y )
{
    typedef typename boost::unit_test::basic_cstring<CharT>::traits_type traits_type;
    return x.size() != y.size()
            ? x.size() < y.size()
            : traits_type::compare( x.begin(), y.begin(), x.size() ) < 0;
}